

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contacts.cc
# Opt level: O2

void RigidBodyDynamics::SolveContactSystemNullSpace
               (MatrixNd *H,MatrixNd *G,VectorNd *c,VectorNd *gamma,VectorNd *qddot,VectorNd *lambda
               ,MatrixNd *Y,MatrixNd *Z,VectorNd *qddot_y,VectorNd *qddot_z,
               LinearSolver *linear_solver)

{
  LinearSolver LVar1;
  VectorNd *pVVar2;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_130;
  VectorNd *local_108;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
  local_100;
  MatrixNd *local_f0;
  VectorNd *local_e8;
  Solve<Eigen::LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
  local_e0;
  ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_d0;
  
  LVar1 = *linear_solver;
  local_100.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)G;
  local_e8 = qddot;
  if (LVar1 == LinearSolverHouseholderQR) {
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::householderQr((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                     *)&local_100);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (qddot_y,(Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&local_130);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0);
  }
  else if (LVar1 == LinearSolverColPivHouseholderQR) {
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::colPivHouseholderQr
              (&local_d0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_100);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (qddot_y,(Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&local_130);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              (&local_d0);
  }
  else if (LVar1 == LinearSolverPartialPivLU) {
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::partialPivLu((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&local_100);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)&local_d0;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)gamma;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (qddot_y,(Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)&local_130);
    Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
              ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0);
  }
  local_100.m_dec = (ColPivHouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Z;
  local_f0 = Z;
  local_108 = lambda;
  local_100.m_rhs =
       (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
        *)H;
  Eigen::LLT<Eigen::Matrix<double,-1,-1,0,-1,-1>,1>::
  LLT<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1> *)&local_130,
             (EigenBase<Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_100);
  local_e0.m_rhs =
       (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
        *)&local_d0;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)Z;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)Y;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = (Index)qddot_y;
  local_e0.m_dec = &local_130;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)c;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)H;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::LLT<Eigen::Matrix<double,_1,_1,0,_1,_1>,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>>>
            (qddot_z,&local_e0);
  free(local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
       .m_data);
  pVVar2 = local_e8;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)Y;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)qddot_y;
  local_d0.m_qr.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Z;
  local_d0.m_hCoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)qddot_z;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            (local_e8,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                       *)&local_d0);
  LVar1 = *linear_solver;
  local_130.m_l1_norm = (RealScalar)c;
  local_e0.m_dec = (LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)G;
  if (LVar1 == LinearSolverPartialPivLU) {
    local_e0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::partialPivLu((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                   (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                    *)&local_e0);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pVVar2;
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_130;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_100.m_dec = &local_d0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>>
              (local_108,
               (Solve<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)&local_100);
    Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~PartialPivLU
              ((PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0);
  }
  else if (LVar1 == LinearSolverColPivHouseholderQR) {
    local_e0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::colPivHouseholderQr
              (&local_d0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_e0);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pVVar2;
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_130;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_100.m_dec = &local_d0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>>
              (local_108,&local_100);
    Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~ColPivHouseholderQR
              (&local_d0);
  }
  else if (LVar1 == LinearSolverHouseholderQR) {
    local_e0.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>
          *)Y;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>
    ::householderQr((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0,
                    (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                     *)&local_e0);
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)Y;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)pVVar2;
    local_100.m_rhs =
         (Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
          *)&local_130;
    local_130.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)H;
    local_100.m_dec = &local_d0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Solve<Eigen::HouseholderQR<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>,0>>>
              (local_108,
               (Solve<Eigen::HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
                *)&local_100);
    Eigen::HouseholderQR<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~HouseholderQR
              ((HouseholderQR<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_d0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void SolveContactSystemNullSpace (
		Math::MatrixNd &H, 
		const Math::MatrixNd &G, 
		const Math::VectorNd &c, 
		const Math::VectorNd &gamma, 
		Math::VectorNd &qddot, 
		Math::VectorNd &lambda,
		Math::MatrixNd &Y,
		Math::MatrixNd &Z,
		Math::VectorNd &qddot_y,
		Math::VectorNd &qddot_z,
		Math::LinearSolver &linear_solver
		) {
	switch (linear_solver) {
		case (LinearSolverPartialPivLU) :
#ifdef RBDL_USE_SIMPLE_MATH
			// SimpleMath does not have a LU solver so just use its QR solver
			qddot_y = (G * Y).householderQr().solve (gamma);
#else
			qddot_y = (G * Y).partialPivLu().solve (gamma);
#endif
			break;
		case (LinearSolverColPivHouseholderQR) :
			qddot_y = (G * Y).colPivHouseholderQr().solve (gamma);
			break;
		case (LinearSolverHouseholderQR) :
			qddot_y = (G * Y).householderQr().solve (gamma);
			break;
		default:
			LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
			assert (0);
			break;
	}

	qddot_z = (Z.transpose() * H * Z).llt().solve(Z.transpose() * (c - H * Y * qddot_y));

	qddot = Y * qddot_y + Z * qddot_z;

	switch (linear_solver) {
		case (LinearSolverPartialPivLU) :
#ifdef RBDL_USE_SIMPLE_MATH
			// SimpleMath does not have a LU solver so just use its QR solver
			qddot_y = (G * Y).householderQr().solve (gamma);
#else
			lambda = (G * Y).partialPivLu().solve (Y.transpose() * (H * qddot - c));
#endif
			break;
		case (LinearSolverColPivHouseholderQR) :
			lambda = (G * Y).colPivHouseholderQr().solve (Y.transpose() * (H * qddot - c));
			break;
		case (LinearSolverHouseholderQR) :
			lambda = (G * Y).householderQr().solve (Y.transpose() * (H * qddot - c));
			break;
		default:
			LOG << "Error: Invalid linear solver: " << linear_solver << std::endl;
			assert (0);
			break;
	}
}